

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcCovering::IfcCovering(IfcCovering *this)

{
  *(undefined ***)&this->field_0x180 = &PTR__Object_008048a0;
  *(undefined8 *)&this->field_0x188 = 0;
  *(char **)&this->field_0x190 = "IfcCovering";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__008445a0);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x844470;
  *(undefined8 *)&this->field_0x180 = 0x844588;
  *(undefined8 *)&this->field_0x88 = 0x844498;
  *(undefined8 *)&this->field_0x98 = 0x8444c0;
  *(undefined8 *)&this->field_0xd0 = 0x8444e8;
  *(undefined8 *)&this->field_0x100 = 0x844510;
  *(undefined8 *)&this->field_0x138 = 0x844538;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x844560;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x10
       = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x18 =
       0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x20 = 0;
  this->field_0x178 = 0;
  return;
}

Assistant:

IfcCovering() : Object("IfcCovering") {}